

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

hostent * co_gethostbyname(char *name)

{
  size_t sVar1;
  int iVar2;
  hostbuf_wrap *phVar3;
  char *pcVar4;
  hostbuf_wrap *phVar5;
  hostbuf_wrap *phVar6;
  hostent *result;
  hostbuf_wrap *local_38;
  
  if (name != (char *)0x0) {
    phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                       ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
    if (phVar3->buffer != (char *)0x0) {
      phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      if (0x400 < phVar3->iBufferSize) {
        phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                           ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap)
        ;
        free(phVar3->buffer);
        phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                           ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap)
        ;
        phVar3->buffer = (char *)0x0;
      }
    }
    phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                       ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
    if (phVar3->buffer == (char *)0x0) {
      pcVar4 = (char *)malloc(0x400);
      phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar3->buffer = pcVar4;
      phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar3->iBufferSize = 0x400;
    }
    phVar3 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                       ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
    local_38 = (hostbuf_wrap *)0x0;
    phVar5 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                       ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
    while( true ) {
      phVar6 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      pcVar4 = phVar6->buffer;
      phVar6 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      iVar2 = gethostbyname_r(name,(hostent *)phVar3,pcVar4,phVar6->iBufferSize,
                              (hostent **)&local_38,&phVar5->host_errno);
      if ((iVar2 != 0x22) || (phVar5->host_errno != -1)) break;
      phVar6 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      free(phVar6->buffer);
      phVar6 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      sVar1 = phVar6->iBufferSize;
      phVar6 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar6->iBufferSize = sVar1 * 2;
      phVar6 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      pcVar4 = (char *)malloc(phVar6->iBufferSize);
      phVar6 = clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap>::operator->
                         ((clsRoutineData_routine_hostbuf_wrap<hostbuf_wrap> *)&__co_hostbuf_wrap);
      phVar6->buffer = pcVar4;
    }
    phVar5 = (hostbuf_wrap *)0x0;
    if (phVar3 == local_38) {
      phVar5 = phVar3;
    }
    return &phVar5->host;
  }
  return (hostent *)0x0;
}

Assistant:

struct hostent *co_gethostbyname(const char *name)
{
	if (!name)
	{
		return NULL;
	}

	if (__co_hostbuf_wrap->buffer && __co_hostbuf_wrap->iBufferSize > 1024)
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->buffer = NULL;
	}
	if (!__co_hostbuf_wrap->buffer)
	{
		__co_hostbuf_wrap->buffer = (char*)malloc(1024);
		__co_hostbuf_wrap->iBufferSize = 1024;
	}

	struct hostent *host = &__co_hostbuf_wrap->host;
	struct hostent *result = NULL;
	int *h_errnop = &(__co_hostbuf_wrap->host_errno);

	int ret = -1;
	while (ret = gethostbyname_r(name, host, __co_hostbuf_wrap->buffer, 
				__co_hostbuf_wrap->iBufferSize, &result, h_errnop) == ERANGE && 
				*h_errnop == NETDB_INTERNAL )
	{
		free(__co_hostbuf_wrap->buffer);
		__co_hostbuf_wrap->iBufferSize = __co_hostbuf_wrap->iBufferSize * 2;
		__co_hostbuf_wrap->buffer = (char*)malloc(__co_hostbuf_wrap->iBufferSize);
	}

	if (ret == 0 && (host == result)) 
	{
		return host;
	}
	return NULL;
}